

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tiled_Image.cxx
# Opt level: O0

void __thiscall Fl_Tiled_Image::color_average(Fl_Tiled_Image *this,Fl_Color c,float i)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *in_RDX;
  undefined4 in_register_00000034;
  float i_local;
  Fl_Color c_local;
  Fl_Tiled_Image *this_local;
  
  if (this->alloc_image_ == 0) {
    iVar1 = Fl_Image::copy(this->image_,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,c),in_RDX);
    this->image_ = (Fl_Image *)CONCAT44(extraout_var,iVar1);
    this->alloc_image_ = 1;
  }
  (*this->image_->_vptr_Fl_Image[3])(i,this->image_,(ulong)c);
  return;
}

Assistant:

void
Fl_Tiled_Image::color_average(Fl_Color c,	// I - Color to blend with
                              float    i) {	// I - Blend fraction
  if (!alloc_image_) {
    image_       = image_->copy();
    alloc_image_ = 1;
  }

  image_->color_average(c, i);
}